

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall crnlib::Resampler::resample_x(Resampler *this,Sample *Pdst,Sample *Psrc)

{
  Contrib local_40;
  Contrib *p;
  Contrib_List *Pclist;
  uint local_28;
  Sample total;
  int j;
  int i;
  Sample *Psrc_local;
  Sample *Pdst_local;
  Resampler *this_local;
  
  p = (Contrib *)this->m_Pclist_x;
  Psrc_local = Pdst;
  for (total = (Sample)this->m_resample_dst_x; 0 < (int)total; total = (Sample)((int)total + -1)) {
    local_40 = p[1];
    Pclist._4_4_ = 0.0;
    for (local_28 = (uint)*(ushort *)&p->weight; 0 < (int)local_28; local_28 = local_28 - 1) {
      Pclist._4_4_ = Psrc[*(ushort *)((long)local_40 + 4)] * *(float *)local_40 + Pclist._4_4_;
      local_40 = (Contrib)((long)local_40 + 8);
    }
    *Psrc_local = Pclist._4_4_;
    p = p + 2;
    Psrc_local = Psrc_local + 1;
  }
  return;
}

Assistant:

void Resampler::resample_x(Sample* Pdst, const Sample* Psrc)
    {
        resampler_assert(Pdst);
        resampler_assert(Psrc);

        int i, j;
        Sample total;
        Contrib_List* Pclist = m_Pclist_x;
        Contrib* p;

        for (i = m_resample_dst_x; i > 0; i--, Pclist++)
        {
#if CRNLIB_RESAMPLER_DEBUG_OPS
            total_ops += Pclist->n;
#endif

            for (j = Pclist->n, p = Pclist->p, total = 0; j > 0; j--, p++)
            {
                total += Psrc[p->pixel] * p->weight;
            }

            *Pdst++ = total;
        }
    }